

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeCommand.cxx
# Opt level: O0

bool __thiscall
cmIncludeCommand::InitialPass
          (cmIncludeCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  cmMakefile *pcVar1;
  MessageType t;
  bool bVar2;
  bool bVar3;
  PolicyStatus PVar4;
  size_type sVar5;
  const_reference pvVar6;
  ulong uVar7;
  char *pcVar8;
  cmGlobalGenerator *this_00;
  ostream *poVar9;
  PolicyID id;
  char *local_510;
  allocator local_409;
  undefined1 local_408 [8];
  string m;
  undefined1 local_3e0 [6];
  bool readit;
  undefined1 local_3c0 [8];
  string listFile;
  string local_380;
  MessageType local_35c;
  undefined1 local_358 [4];
  MessageType messageType;
  ostringstream e;
  char *local_1e0;
  char *modal;
  cmGlobalGenerator *gg;
  string fname_abs;
  string mfile;
  string module;
  string local_168;
  allocator local_141;
  undefined1 local_140 [8];
  string errorText;
  string local_118;
  allocator local_f1;
  string local_f0;
  int local_d0;
  allocator local_c9;
  string local_c8;
  uint local_a4;
  undefined1 local_a0 [4];
  uint i;
  string resultVarName;
  string fname;
  bool noPolicyScope;
  bool optional;
  allocator local_49;
  string local_48;
  cmExecutionStatus *local_28;
  cmExecutionStatus *param_2_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmIncludeCommand *this_local;
  
  local_28 = param_2;
  param_2_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if ((sVar5 == 0) ||
     (sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_2_local), 4 < sVar5)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_48,
               "called with wrong number of arguments.  include() only takes one file.",&local_49);
    cmCommand::SetError(&this->super_cmCommand,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    this_local._7_1_ = 0;
    goto LAB_005c5cc4;
  }
  bVar3 = false;
  fname.field_2._M_local_buf[10] = '\0';
  pvVar6 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)param_2_local,0);
  std::__cxx11::string::string((string *)(resultVarName.field_2._M_local_buf + 8),(string *)pvVar6);
  std::__cxx11::string::string((string *)local_a0);
  for (local_a4 = 1; uVar7 = (ulong)local_a4,
      sVar5 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)param_2_local), uVar7 < sVar5; local_a4 = local_a4 + 1) {
    pvVar6 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)param_2_local,(ulong)local_a4);
    bVar2 = std::operator==(pvVar6,"OPTIONAL");
    if (bVar2) {
      if (bVar3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_c8,"called with invalid arguments: OPTIONAL used twice",
                   &local_c9);
        cmCommand::SetError(&this->super_cmCommand,&local_c8);
        std::__cxx11::string::~string((string *)&local_c8);
        std::allocator<char>::~allocator((allocator<char> *)&local_c9);
        this_local._7_1_ = 0;
        local_d0 = 1;
        goto LAB_005c5c96;
      }
      bVar3 = true;
    }
    else {
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)param_2_local,(ulong)local_a4);
      bVar2 = std::operator==(pvVar6,"RESULT_VARIABLE");
      if (bVar2) {
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_f0,
                     "called with invalid arguments: only one result variable allowed",&local_f1);
          cmCommand::SetError(&this->super_cmCommand,&local_f0);
          std::__cxx11::string::~string((string *)&local_f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_f1);
          this_local._7_1_ = 0;
          local_d0 = 1;
          goto LAB_005c5c96;
        }
        local_a4 = local_a4 + 1;
        uVar7 = (ulong)local_a4;
        sVar5 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)param_2_local);
        if (sVar5 <= uVar7) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_118,"called with no value for RESULT_VARIABLE.",
                     (allocator *)(errorText.field_2._M_local_buf + 0xf));
          cmCommand::SetError(&this->super_cmCommand,&local_118);
          std::__cxx11::string::~string((string *)&local_118);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(errorText.field_2._M_local_buf + 0xf));
          this_local._7_1_ = 0;
          local_d0 = 1;
          goto LAB_005c5c96;
        }
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,(ulong)local_a4);
        std::__cxx11::string::operator=((string *)local_a0,(string *)pvVar6);
      }
      else {
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)param_2_local,(ulong)local_a4);
        bVar2 = std::operator==(pvVar6,"NO_POLICY_SCOPE");
        if (bVar2) {
          fname.field_2._M_local_buf[10] = '\x01';
        }
        else if (1 < local_a4) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_140,"called with invalid argument: ",&local_141);
          std::allocator<char>::~allocator((allocator<char> *)&local_141);
          pvVar6 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)param_2_local,(ulong)local_a4);
          std::__cxx11::string::operator+=((string *)local_140,(string *)pvVar6);
          cmCommand::SetError(&this->super_cmCommand,(string *)local_140);
          this_local._7_1_ = 0;
          local_d0 = 1;
          std::__cxx11::string::~string((string *)local_140);
          goto LAB_005c5c96;
        }
      }
    }
  }
  uVar7 = std::__cxx11::string::empty();
  if ((uVar7 & 1) == 0) {
    pcVar8 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::SystemTools::FileIsFullPath(pcVar8);
    if (!bVar2) {
      std::__cxx11::string::string
                ((string *)(mfile.field_2._M_local_buf + 8),
                 (string *)(resultVarName.field_2._M_local_buf + 8));
      std::__cxx11::string::operator+=((string *)(mfile.field_2._M_local_buf + 8),".cmake");
      pcVar1 = (this->super_cmCommand).Makefile;
      pcVar8 = (char *)std::__cxx11::string::c_str();
      cmMakefile::GetModulesFile_abi_cxx11_((string *)((long)&fname_abs.field_2 + 8),pcVar1,pcVar8);
      uVar7 = std::__cxx11::string::empty();
      if ((uVar7 & 1) == 0) {
        pcVar8 = (char *)std::__cxx11::string::c_str();
        std::__cxx11::string::operator=((string *)(resultVarName.field_2._M_local_buf + 8),pcVar8);
      }
      std::__cxx11::string::~string((string *)(fname_abs.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(mfile.field_2._M_local_buf + 8));
    }
    pcVar8 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
    cmsys::SystemTools::CollapseFullPath
              ((string *)&gg,(string *)((long)&resultVarName.field_2 + 8),pcVar8);
    this_00 = cmMakefile::GetGlobalGenerator((this->super_cmCommand).Makefile);
    bVar2 = cmGlobalGenerator::IsExportedTargetsFile(this_00,(string *)&gg);
    if (bVar2) {
      local_1e0 = (char *)0x0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_358);
      local_35c = AUTHOR_WARNING;
      PVar4 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0024);
      if (PVar4 != OLD) {
        if (PVar4 == WARN) {
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_380,(cmPolicies *)0x18,id);
          poVar9 = std::operator<<((ostream *)local_358,(string *)&local_380);
          std::operator<<(poVar9,"\n");
          std::__cxx11::string::~string((string *)&local_380);
          local_1e0 = "should";
        }
        else if (PVar4 - NEW < 3) {
          local_1e0 = "may";
          local_35c = FATAL_ERROR;
        }
      }
      if (local_1e0 == (char *)0x0) {
LAB_005c5905:
        cmGlobalGenerator::CreateGenerationObjects(this_00,AllTargets);
        cmGlobalGenerator::GenerateImportFile(this_00,(string *)&gg);
        local_d0 = 0;
      }
      else {
        poVar9 = std::operator<<((ostream *)local_358,"The file\n  ");
        poVar9 = std::operator<<(poVar9,(string *)&gg);
        poVar9 = std::operator<<(poVar9,"\nwas generated by the export() command.  It ");
        poVar9 = std::operator<<(poVar9,local_1e0);
        std::operator<<(poVar9,
                        " not be used as the argument to the include() command.  Use ALIAS targets instead to refer to targets by alternative names.\n"
                       );
        t = local_35c;
        pcVar1 = (this->super_cmCommand).Makefile;
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(pcVar1,t,(string *)((long)&listFile.field_2 + 8),false);
        std::__cxx11::string::~string((string *)(listFile.field_2._M_local_buf + 8));
        if (local_35c != FATAL_ERROR) goto LAB_005c5905;
        this_local._7_1_ = 0;
        local_d0 = 1;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_358);
      if (local_d0 == 0) goto LAB_005c5963;
    }
    else {
LAB_005c5963:
      pcVar8 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_3e0,pcVar8,(allocator *)(m.field_2._M_local_buf + 0xf));
      pcVar8 = cmMakefile::GetCurrentSourceDirectory((this->super_cmCommand).Makefile);
      cmsys::SystemTools::CollapseFullPath((string *)local_3c0,(string *)local_3e0,pcVar8);
      std::__cxx11::string::~string((string *)local_3e0);
      std::allocator<char>::~allocator((allocator<char> *)(m.field_2._M_local_buf + 0xf));
      if (bVar3) {
        pcVar8 = (char *)std::__cxx11::string::c_str();
        bVar2 = cmsys::SystemTools::FileExists(pcVar8);
        if (bVar2) goto LAB_005c5ab2;
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          cmMakefile::AddDefinition((this->super_cmCommand).Makefile,(string *)local_a0,"NOTFOUND");
        }
        this_local._7_1_ = 1;
        local_d0 = 1;
      }
      else {
LAB_005c5ab2:
        pcVar1 = (this->super_cmCommand).Makefile;
        pcVar8 = (char *)std::__cxx11::string::c_str();
        m.field_2._M_local_buf[0xe] =
             cmMakefile::ReadDependentFile(pcVar1,pcVar8,(bool)fname.field_2._M_local_buf[10]);
        uVar7 = std::__cxx11::string::empty();
        if ((uVar7 & 1) == 0) {
          pcVar1 = (this->super_cmCommand).Makefile;
          if ((m.field_2._M_local_buf[0xe] & 1U) == 0) {
            local_510 = "NOTFOUND";
          }
          else {
            local_510 = (char *)std::__cxx11::string::c_str();
          }
          cmMakefile::AddDefinition(pcVar1,(string *)local_a0,local_510);
        }
        if (((bVar3) || ((m.field_2._M_local_buf[0xe] & 1U) != 0)) ||
           (bVar3 = cmSystemTools::GetFatalErrorOccured(), bVar3)) {
          this_local._7_1_ = 1;
          local_d0 = 1;
        }
        else {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_408,"could not find load file:\n  ",&local_409);
          std::allocator<char>::~allocator((allocator<char> *)&local_409);
          std::__cxx11::string::operator+=
                    ((string *)local_408,(string *)(resultVarName.field_2._M_local_buf + 8));
          cmCommand::SetError(&this->super_cmCommand,(string *)local_408);
          this_local._7_1_ = 0;
          local_d0 = 1;
          std::__cxx11::string::~string((string *)local_408);
        }
      }
      std::__cxx11::string::~string((string *)local_3c0);
    }
    std::__cxx11::string::~string((string *)&gg);
  }
  else {
    pcVar1 = (this->super_cmCommand).Makefile;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_168,"include() given empty file name (ignored).",
               (allocator *)(module.field_2._M_local_buf + 0xf));
    cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&local_168,false);
    std::__cxx11::string::~string((string *)&local_168);
    std::allocator<char>::~allocator((allocator<char> *)(module.field_2._M_local_buf + 0xf));
    this_local._7_1_ = 1;
    local_d0 = 1;
  }
LAB_005c5c96:
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)(resultVarName.field_2._M_local_buf + 8));
LAB_005c5cc4:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmIncludeCommand
::InitialPass(std::vector<std::string> const& args, cmExecutionStatus &)
{
  if (args.size()< 1 || args.size() > 4)
    {
      this->SetError("called with wrong number of arguments.  "
                     "include() only takes one file.");
      return false;
    }
  bool optional = false;
  bool noPolicyScope = false;
  std::string fname = args[0];
  std::string resultVarName;

  for (unsigned int i=1; i<args.size(); i++)
    {
    if (args[i] == "OPTIONAL")
      {
      if (optional)
        {
        this->SetError("called with invalid arguments: OPTIONAL used twice");
        return false;
        }
      optional = true;
      }
    else if(args[i] == "RESULT_VARIABLE")
      {
      if (!resultVarName.empty())
        {
        this->SetError("called with invalid arguments: "
            "only one result variable allowed");
        return false;
        }
      if(++i < args.size())
        {
        resultVarName = args[i];
        }
      else
        {
        this->SetError("called with no value for RESULT_VARIABLE.");
        return false;
        }
      }
    else if(args[i] == "NO_POLICY_SCOPE")
      {
      noPolicyScope = true;
      }
      else if(i > 1)  // compat.: in previous cmake versions the second
                      // parameter was ignored if it wasn't "OPTIONAL"
        {
        std::string errorText = "called with invalid argument: ";
        errorText += args[i];
        this->SetError(errorText);
        return false;
        }
    }

  if(fname.empty())
    {
    this->Makefile->IssueMessage(cmake::AUTHOR_WARNING,
                                 "include() given empty file name (ignored).");
    return true;
    }

  if(!cmSystemTools::FileIsFullPath(fname.c_str()))
    {
    // Not a path. Maybe module.
    std::string module = fname;
    module += ".cmake";
    std::string mfile = this->Makefile->GetModulesFile(module.c_str());
    if (!mfile.empty())
      {
      fname = mfile.c_str();
      }
    }

  std::string fname_abs =
      cmSystemTools::CollapseFullPath(fname,
                                 this->Makefile->GetCurrentSourceDirectory());

  cmGlobalGenerator *gg = this->Makefile->GetGlobalGenerator();
  if (gg->IsExportedTargetsFile(fname_abs))
    {
    const char *modal = 0;
    std::ostringstream e;
    cmake::MessageType messageType = cmake::AUTHOR_WARNING;

    switch(this->Makefile->GetPolicyStatus(cmPolicies::CMP0024))
      {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0024) << "\n";
        modal = "should";
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        modal = "may";
        messageType = cmake::FATAL_ERROR;
      }
    if (modal)
      {
      e << "The file\n  " << fname_abs << "\nwas generated by the export() "
        "command.  It " << modal << " not be used as the argument to the "
        "include() command.  Use ALIAS targets instead to refer to targets "
        "by alternative names.\n";
      this->Makefile->IssueMessage(messageType, e.str());
      if (messageType == cmake::FATAL_ERROR)
        {
        return false;
        }
      }
    gg->CreateGenerationObjects();
    gg->GenerateImportFile(fname_abs);
    }

  std::string listFile =
    cmSystemTools::CollapseFullPath(fname.c_str(),
                                  this->Makefile->GetCurrentSourceDirectory());
  if(optional && !cmSystemTools::FileExists(listFile.c_str()))
    {
    if (!resultVarName.empty())
      {
      this->Makefile->AddDefinition(resultVarName, "NOTFOUND");
      }
    return true;
    }

  bool readit =
    this->Makefile->ReadDependentFile(listFile.c_str(), noPolicyScope);

  // add the location of the included file if a result variable was given
  if (!resultVarName.empty())
    {
      this->Makefile->AddDefinition(resultVarName,
                                    readit?fname_abs.c_str():"NOTFOUND");
    }

  if(!optional && !readit && !cmSystemTools::GetFatalErrorOccured())
    {
    std::string m =
      "could not find load file:\n"
      "  ";
    m += fname;
    this->SetError(m);
    return false;
    }
  return true;
}